

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

int Cec_GiaSplitTest2(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose,
                     int fVeryVerbose,int fSilent)

{
  int iVar1;
  uint iVar;
  uint uVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  Cnf_Dat_t *pCVar6;
  abctime aVar7;
  Vec_Ptr_t *p_00;
  Gia_Man_t *pGVar8;
  Gia_Man_t *p_01;
  Vec_Int_t *pVVar9;
  abctime time;
  int nCap;
  char *pcVar10;
  int iVar11;
  uint nIter;
  double dVar12;
  int local_7c;
  int nSatConfs;
  int nSatVars;
  double local_70;
  int local_64;
  int local_60;
  int local_5c;
  Vec_Ptr_t *local_58;
  abctime local_50;
  Gia_Man_t *local_48;
  int local_40;
  int local_3c;
  int Cost;
  int nFanouts;
  
  local_40 = nIterMax;
  local_3c = LookAhead;
  aVar5 = Abc_Clock();
  pCVar6 = Cec_GiaDeriveGiaRemapped(p);
  local_60 = nTimeOut;
  local_48 = p;
  iVar1 = Cnf_GiaSolveOne(p,pCVar6,nTimeOut,&nSatVars,&nSatConfs);
  Cnf_DataFree(pCVar6);
  iVar11 = nSatVars;
  iVar4 = nSatConfs;
  nCap = (int)pCVar6;
  local_5c = fVerbose;
  if (fVerbose != 0) {
    aVar7 = Abc_Clock();
    nCap = 0;
    Cec_GiaSplitPrint(0,0,iVar11,iVar4,iVar1,0.0,aVar7 - aVar5);
  }
  if (iVar1 == -1) {
    p_00 = Vec_PtrAlloc(nCap);
    pGVar8 = Gia_ManDup(local_48);
    Vec_PtrPush(p_00,pGVar8);
    nIter = 1;
    local_70 = 0.0;
    local_64 = -1;
    local_58 = p_00;
    local_50 = aVar5;
    while( true ) {
      iVar11 = (int)aVar5;
      iVar4 = p_00->nSize;
      if (iVar4 < 1) break;
      pGVar8 = (Gia_Man_t *)Vec_PtrPop(p_00);
      local_7c = 1;
      if (pGVar8->vCofVars != (Vec_Int_t *)0x0) {
        local_7c = pGVar8->vCofVars->nSize + 1;
      }
      iVar = Gia_SplitCofVar(pGVar8,local_3c,&nFanouts,&Cost);
      p_01 = Gia_ManDupCofactorVar(pGVar8,iVar,0);
      pVVar9 = pGVar8->vCofVars;
      if (pVVar9 == (Vec_Int_t *)0x0) {
        pVVar9 = Vec_IntAlloc(100);
        pGVar8->vCofVars = pVVar9;
      }
      iVar11 = nFanouts;
      iVar4 = Cost;
      if (fVeryVerbose != 0) {
        uVar2 = Gia_ManAndNum(pGVar8);
        uVar3 = Gia_ManAndNum(p_01);
        printf("Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n",
               (ulong)iVar,(ulong)(uint)iVar11,(ulong)(uint)iVar4,(ulong)uVar2,(ulong)uVar3);
        pVVar9 = pGVar8->vCofVars;
      }
      pVVar9 = Vec_IntAlloc(pVVar9->nSize + 1);
      p_01->vCofVars = pVVar9;
      Vec_IntAppend(pVVar9,pGVar8->vCofVars);
      Vec_IntPush(p_01->vCofVars,iVar * 2 + 1);
      pCVar6 = Cec_GiaDeriveGiaRemapped(p_01);
      iVar4 = Cnf_GiaSolveOne(p_01,pCVar6,local_60,&nSatVars,&nSatConfs);
      Cnf_DataFree(pCVar6);
      if (iVar4 == 1) {
        dVar12 = ldexp(1.0,local_7c);
        local_70 = local_70 + 1.0 / dVar12;
      }
      iVar1 = nSatVars;
      iVar11 = nSatConfs;
      if (local_5c != 0) {
        aVar5 = Abc_Clock();
        Cec_GiaSplitPrint(nIter,local_7c,iVar1,iVar11,iVar4,local_70,aVar5 - local_50);
      }
      if (iVar4 == 0) {
        local_48->pCexComb = p_01->pCexComb;
        p_01->pCexComb = (Abc_Cex_t *)0x0;
        Gia_ManStop(pGVar8);
        aVar5 = local_50;
        p_00 = local_58;
LAB_004dbe77:
        Gia_ManStop(p_01);
        local_64 = 0;
LAB_004dbe8c:
        iVar11 = (int)aVar5;
        iVar4 = p_00->nSize;
        break;
      }
      if (iVar4 == 1) {
        Gia_ManStop(p_01);
      }
      else {
        Vec_PtrPush(local_58,p_01);
      }
      p_01 = Gia_ManDupCofactorVar(pGVar8,iVar,1);
      pVVar9 = Vec_IntAlloc(pGVar8->vCofVars->nSize + 1);
      p_01->vCofVars = pVVar9;
      Vec_IntAppend(pVVar9,pGVar8->vCofVars);
      Vec_IntPush(p_01->vCofVars,iVar * 2);
      Gia_ManStop(pGVar8);
      pCVar6 = Cec_GiaDeriveGiaRemapped(p_01);
      iVar4 = Cnf_GiaSolveOne(p_01,pCVar6,local_60,&nSatVars,&nSatConfs);
      Cnf_DataFree(pCVar6);
      if (iVar4 == 1) {
        dVar12 = ldexp(1.0,local_7c);
        local_70 = local_70 + 1.0 / dVar12;
      }
      aVar5 = local_50;
      p_00 = local_58;
      iVar1 = nSatVars;
      iVar11 = nSatConfs;
      if (local_5c != 0) {
        aVar7 = Abc_Clock();
        Cec_GiaSplitPrint(nIter,local_7c,iVar1,iVar11,iVar4,local_70,aVar7 - aVar5);
      }
      if (iVar4 == 0) {
        local_48->pCexComb = p_01->pCexComb;
        p_01->pCexComb = (Abc_Cex_t *)0x0;
        goto LAB_004dbe77;
      }
      if (iVar4 == 1) {
        Gia_ManStop(p_01);
      }
      else {
        Vec_PtrPush(p_00,p_01);
      }
      if (local_40 <= (int)nIter && local_40 != 0) goto LAB_004dbe8c;
      nIter = nIter + 1;
    }
    iVar1 = 1;
    if (iVar4 != 0) {
      iVar1 = local_64;
    }
    Cec_GiaSplitClean(p_00);
    if (fSilent == 0) {
      printf((&PTR_anon_var_dwarf_58e53c_0098ccb0)[iVar1]);
      pcVar10 = (char *)(ulong)nIter;
      printf("after %d case-splits.  ");
      aVar5 = Abc_Clock();
      Abc_PrintTime((int)aVar5 - iVar11,pcVar10,time);
      fflush(_stdout);
    }
  }
  else {
    if (iVar1 == 1) {
      iVar1 = 1;
      if (fSilent != 0) {
        return 1;
      }
      pcVar10 = "The problem is UNSAT without cofactoring.";
    }
    else {
      iVar1 = 0;
      if (fSilent != 0) {
        return 0;
      }
      pcVar10 = "The problem is SAT without cofactoring.";
    }
    puts(pcVar10);
  }
  return iVar1;
}

Assistant:

int Cec_GiaSplitTest2( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    abctime clkTotal = Abc_Clock();
    Vec_Ptr_t * vStack;
    Cnf_Dat_t * pCnf;
    int nSatVars, nSatConfs;
    int nIter, status, RetValue = -1;
    double Progress = 0;
    // check the problem
    pCnf = Cec_GiaDeriveGiaRemapped( p );
    status = Cnf_GiaSolveOne( p, pCnf, nTimeOut, &nSatVars, &nSatConfs );
    Cnf_DataFree( pCnf );
    if ( fVerbose )
        Cec_GiaSplitPrint( 0, 0, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
    if ( status == 0 )
    {
		if ( !fSilent )
        printf( "The problem is SAT without cofactoring.\n" );
        return 0;
    }
    if ( status == 1 )
    {
		if ( !fSilent )
        printf( "The problem is UNSAT without cofactoring.\n" );
        return 1;
    }
    assert( status == -1 );
    // create local copy
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrPush( vStack, Gia_ManDup(p) );
    // start with the current problem
    for ( nIter = 1; Vec_PtrSize(vStack) > 0; nIter++ )
    {
        // get the last AIG
        Gia_Man_t * pLast = (Gia_Man_t *)Vec_PtrPop( vStack );
        // determine cofactoring variable
        int Depth = 1 + (pLast->vCofVars ? Vec_IntSize(pLast->vCofVars) : 0);
        int nFanouts, Cost, iVar  = Gia_SplitCofVar( pLast, LookAhead, &nFanouts, &Cost );
        // cofactor
        Gia_Man_t * pPart = Gia_ManDupCofactorVar( pLast, iVar, 0 );
        if ( pLast->vCofVars == NULL )
            pLast->vCofVars = Vec_IntAlloc( 100 );
        // print results
        if ( fVeryVerbose )
        {
//            Cec_GiaSplitPrintRefs( pLast );
            printf( "Var = %5d. Fanouts = %5d. Cost = %8d.  AndBefore = %6d.  AndAfter = %6d.\n", 
                iVar, nFanouts, Cost, Gia_ManAndNum(pLast), Gia_ManAndNum(pPart) );
//            Cec_GiaSplitPrintRefs( pPart );
        }
        // create variable
        pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
        Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
        Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 1) );
        // solve the problem
        pCnf = Cec_GiaDeriveGiaRemapped( pPart );
        status = Cnf_GiaSolveOne( pPart, pCnf, nTimeOut, &nSatVars, &nSatConfs );
        Cnf_DataFree( pCnf );
        if ( status == 1 )
            Progress += 1.0 / pow(2, Depth);
        if ( fVerbose ) 
            Cec_GiaSplitPrint( nIter, Depth, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
        if ( status == 0 ) // SAT
        {
            p->pCexComb = pPart->pCexComb;  pPart->pCexComb = NULL;
            Gia_ManStop( pLast );
            Gia_ManStop( pPart );
            RetValue = 0;
            break;
        }
        if ( status == 1 ) // UNSAT
            Gia_ManStop( pPart );
        else               // UNDEC
            Vec_PtrPush( vStack, pPart );
        // cofactor
        pPart = Gia_ManDupCofactorVar( pLast, iVar, 1 );
        // create variable
        pPart->vCofVars = Vec_IntAlloc( Vec_IntSize(pLast->vCofVars) + 1 );
        Vec_IntAppend( pPart->vCofVars, pLast->vCofVars );
        Vec_IntPush( pPart->vCofVars, Abc_Var2Lit(iVar, 0) );
        Gia_ManStop( pLast );
        // solve the problem
        pCnf = Cec_GiaDeriveGiaRemapped( pPart );
        status = Cnf_GiaSolveOne( pPart, pCnf, nTimeOut, &nSatVars, &nSatConfs );
        Cnf_DataFree( pCnf );
        if ( status == 1 )
            Progress += 1.0 / pow(2, Depth);
        if ( fVerbose )
            Cec_GiaSplitPrint( nIter, Depth, nSatVars, nSatConfs, status, Progress, Abc_Clock() - clkTotal );
        if ( status == 0 ) // SAT
        {
            p->pCexComb = pPart->pCexComb;  pPart->pCexComb = NULL;
            Gia_ManStop( pPart );
            RetValue = 0;
            break;
        }
        if ( status == 1 ) // UNSAT
            Gia_ManStop( pPart );
        else               // UNDEC
            Vec_PtrPush( vStack, pPart );
        if ( nIterMax && nIter >= nIterMax )
            break;
    }
    if ( Vec_PtrSize(vStack) == 0 )
        RetValue = 1;
    // finish
    Cec_GiaSplitClean( vStack );
	if ( !fSilent )
	{
		if ( RetValue == 0 )
			printf( "Problem is SAT " );
		else if ( RetValue == 1 )
			printf( "Problem is UNSAT " );
		else if ( RetValue == -1 )
			printf( "Problem is UNDECIDED " );
		else assert( 0 );
		printf( "after %d case-splits.  ", nIter );
		Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
		fflush( stdout );
	}
    return RetValue;
}